

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscreteParameters.cpp
# Opt level: O2

void __thiscall PlanningUnitMADPDiscreteParameters::Print(PlanningUnitMADPDiscreteParameters *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeIndividualObservationHistories: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeIndividualActionHistories: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeIndividualActionObservationHistories: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeJointObservationHistories: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeJointActionHistories: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeJointActionObservationHistories: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ComputeJointBeliefs: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"UseSparseJointBeliefs: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void PlanningUnitMADPDiscreteParameters::Print() const
{
    cout << "ComputeIndividualObservationHistories: "
         << GetComputeIndividualObservationHistories() << endl;

    cout << "ComputeIndividualActionHistories: "
         << GetComputeIndividualActionHistories() << endl;

    cout << "ComputeIndividualActionObservationHistories: "
         << GetComputeIndividualActionObservationHistories() << endl;

    cout << "ComputeJointObservationHistories: "
         << GetComputeJointObservationHistories() << endl;

    cout << "ComputeJointActionHistories: "
         << GetComputeJointActionHistories() << endl;

    cout << "ComputeJointActionObservationHistories: "
         << GetComputeJointActionObservationHistories() << endl;

    cout << "ComputeJointBeliefs: "
         << GetComputeJointBeliefs() << endl;

    cout << "UseSparseJointBeliefs: "
         << GetUseSparseJointBeliefs() << endl;
}